

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# term.hh
# Opt level: O0

streambuf * __thiscall OB::Term::ostream::streambuf::flush(streambuf *this)

{
  streambuf *psVar1;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  streambuf *this_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    if (this->_size == 0) {
      psVar1 = this->_streambuf;
      lVar4 = std::__cxx11::string::data();
      std::__cxx11::string::size();
      std::streambuf::sputn((char *)psVar1,lVar4);
    }
    else {
      if ((this->_white_space & 1U) == 0) {
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) == 0) {
          pcVar3 = (char *)std::__cxx11::string::back();
          if (*pcVar3 == ' ') {
            lVar4 = std::__cxx11::string::size();
            std::__cxx11::string::erase((ulong)&this->_buffer,lVar4 - 1);
          }
        }
      }
      psVar1 = this->_streambuf;
      lVar4 = std::__cxx11::string::data();
      std::__cxx11::string::size();
      std::streambuf::sputn((char *)psVar1,lVar4);
      psVar1 = this->_streambuf;
      lVar4 = std::__cxx11::string::data();
      std::__cxx11::string::size();
      std::streambuf::sputn((char *)psVar1,lVar4);
    }
    std::streambuf::sputc((char)this->_streambuf);
  }
  this->_size = 0;
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  return this;
}

Assistant:

streambuf& flush()
    {
      if (! _buffer.empty())
      {
        if (_size)
        {
          if (! _white_space && ! _buffer.empty() && _buffer.back() == ' ')
          {
            _buffer.erase(_buffer.size() - 1);
          }

          _streambuf->sputn(_prefix.data(), static_cast<std::streamsize>(_prefix.size()));
          _streambuf->sputn(_buffer.data(), static_cast<std::streamsize>(_buffer.size()));
        }
        else
        {
          _streambuf->sputn(_buffer.data(), static_cast<std::streamsize>(_buffer.size()));
        }

        _streambuf->sputc('\n');
      }

      _size = 0;
      _buffer.clear();
      _esc_seq.clear();

      return *this;
    }